

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int ret;
  whisper_params *in_stack_00000030;
  whisper_params params;
  whisper_params *in_stack_00000868;
  int local_54;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_4;
  
  whisper_params::whisper_params
            ((whisper_params *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  bVar1 = whisper_params_parse(params.model._4_4_,(char **)params._0_8_,in_stack_00000030);
  if (bVar1) {
    local_54 = -1;
    if (in_stack_ffffffffffffffc4 == 0) {
      local_54 = whisper_bench_full(in_stack_00000868);
    }
    else if (in_stack_ffffffffffffffc4 == 1) {
      local_54 = whisper_bench_memcpy(in_stack_ffffffffffffffc0);
    }
    else if (in_stack_ffffffffffffffc4 == 2) {
      local_54 = whisper_bench_ggml_mul_mat(in_stack_ffffffffffffffc0);
    }
    else {
      fprintf(_stderr,"error: unknown benchmark: %d\n",(ulong)in_stack_ffffffffffffffc4);
    }
    local_4 = local_54;
  }
  else {
    local_4 = 1;
  }
  whisper_params::~whisper_params((whisper_params *)0x10270b);
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    whisper_params params;

    if (whisper_params_parse(argc, argv, params) == false) {
        return 1;
    }

    int ret = -1;

    switch (params.what) {
        case 0: ret = whisper_bench_full(params);                break;
        case 1: ret = whisper_bench_memcpy(params.n_threads);       break;
        case 2: ret = whisper_bench_ggml_mul_mat(params.n_threads); break;
        default: fprintf(stderr, "error: unknown benchmark: %d\n", params.what); break;
    }

    return ret;
}